

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O1

void __thiscall
bk_lib::pod_vector<Clasp::DomainTable::ValueType,_std::allocator<Clasp::DomainTable::ValueType>_>::
pod_vector(pod_vector<Clasp::DomainTable::ValueType,_std::allocator<Clasp::DomainTable::ValueType>_>
           *this,pod_vector<Clasp::DomainTable::ValueType,_std::allocator<Clasp::DomainTable::ValueType>_>
                 *other)

{
  uint uVar1;
  pointer __src;
  ValueType *pVVar2;
  
  uVar1 = (other->ebo_).size;
  (this->ebo_).buf = (pointer)0x0;
  (this->ebo_).size = 0;
  (this->ebo_).cap = uVar1;
  if ((ulong)uVar1 != 0) {
    pVVar2 = __gnu_cxx::new_allocator<Clasp::DomainTable::ValueType>::allocate
                       ((new_allocator<Clasp::DomainTable::ValueType> *)this,(ulong)uVar1,
                        (void *)0x0);
    (this->ebo_).buf = pVVar2;
  }
  __src = (other->ebo_).buf;
  if (__src != (pointer)0x0) {
    memcpy((this->ebo_).buf,__src,(ulong)(other->ebo_).size * 0xc);
  }
  (this->ebo_).size = (other->ebo_).size;
  return;
}

Assistant:

pod_vector(const pod_vector& other) : ebo_(other.size(), other.get_allocator()) {
		if (const_pointer buf = other.begin()) {
			std::memcpy(ebo_.buf, buf, other.size()*sizeof(T));
		}
		ebo_.size = other.size();
	}